

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall cs_impl::any::recycle(any *this)

{
  long *in_RDI;
  
  if ((*in_RDI != 0) &&
     (*(long *)(*in_RDI + 8) = *(long *)(*in_RDI + 8) + -1, *(long *)(*in_RDI + 8) == 0)) {
    cs::allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider>::free
              ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *)
               allocator,(void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void recycle() noexcept
		{
			if (mDat != nullptr) {
				--mDat->refcount;
				if (mDat->refcount == 0) {
					allocator.free(mDat);
					mDat = nullptr;
				}
			}
		}